

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_block(SyntaxAnalyze *this)

{
  bool bVar1;
  SyntaxAnalyze *in_RDI;
  SyntaxAnalyze *unaff_retaddr;
  Token in_stack_0000015c;
  SyntaxAnalyze *in_stack_00000160;
  SyntaxAnalyze *pSVar2;
  
  pSVar2 = in_RDI;
  match_one_word(in_stack_00000160,in_stack_0000015c);
  in_layer(in_RDI);
  while( true ) {
    bVar1 = try_word(unaff_retaddr,(int)((ulong)pSVar2 >> 0x20),(Token)pSVar2);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    gm_block_item(in_RDI);
  }
  out_layer(in_RDI);
  match_one_word(in_stack_00000160,in_stack_0000015c);
  return;
}

Assistant:

void SyntaxAnalyze::gm_block() {
  match_one_word(Token::LBRACE);
  in_layer();

  while (!try_word(1, Token::RBRACE)) {
    gm_block_item();
  }

  out_layer();
  match_one_word(Token::RBRACE);
}